

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O2

RuleBuilder * __thiscall Potassco::RuleBuilder::weaken(RuleBuilder *this,Body_t to,bool w)

{
  int iVar1;
  uint *puVar2;
  WeightLit_t *pWVar3;
  WeightLit_t *pWVar4;
  Weight_t *pWVar5;
  Lit_t *pLVar6;
  Weight_t WVar7;
  uint uVar8;
  
  puVar2 = (uint *)(this->mem_).beg_;
  if (puVar2[3] >> 0x1e != to.val_ && 0x3fffffff < puVar2[3]) {
    pWVar3 = wlits_begin(this);
    pWVar4 = wlits_end(this);
    if (to.val_ == Normal) {
      uVar8 = (puVar2[3] & 0x3fffffff) - 4;
      puVar2[4] = uVar8;
      puVar2[3] = uVar8 & 0x3fffffff;
      for (; pWVar3 != pWVar4; pWVar3 = pWVar3 + 1) {
        pLVar6 = (Lit_t *)MemoryRegion::operator[](&this->mem_,(ulong)uVar8);
        *pLVar6 = pWVar3->lit;
        uVar8 = uVar8 + 4;
      }
      puVar2[4] = uVar8;
      if (uVar8 < puVar2[2]) {
        uVar8 = puVar2[2];
      }
      *puVar2 = *puVar2 & 0x80000000 | uVar8 & 0x7fffffff;
    }
    else if (pWVar3 != pWVar4 && (w && to.val_ == Count)) {
      pWVar5 = bound_(this);
      iVar1 = *pWVar5;
      WVar7 = pWVar3->weight;
      for (; pWVar3 != pWVar4; pWVar3 = pWVar3 + 1) {
        if (pWVar3->weight <= WVar7) {
          WVar7 = pWVar3->weight;
        }
        pWVar3->weight = 1;
      }
      setBound(this,(iVar1 + WVar7 + -1) / WVar7);
    }
    puVar2[3] = puVar2[3] & 0x3fffffff | to.val_ << 0x1e;
  }
  return this;
}

Assistant:

RuleBuilder& RuleBuilder::weaken(Body_t to, bool w) {
	Rule* r = rule_();
	if (r->body.type == Body_t::Normal || r->body.type == to) { return *this; }
	WeightLit_t* bIt = wlits_begin(), *bEnd = wlits_end();
	if (to == Body_t::Normal) {
		uint32_t i = r->body.mbeg - sizeof(Weight_t);
		r->body.init(i, 0);
		for (; bIt != bEnd; ++bIt, i += sizeof(Lit_t)) {
			new (mem_[i])Lit_t(bIt->lit);
		}
		r->body.mend = i;
		r->top = std::max(r->head.mend, r->body.mend);
	}
	else if (to == Body_t::Count && w && bIt != bEnd) {
		Weight_t bnd = *bound_(), min = bIt->weight;
		for (; bIt != bEnd; ++bIt) {
			if (min > bIt->weight) { min = bIt->weight; }
			bIt->weight = 1;
		}
		setBound((bnd+(min-1))/min);
	}
	r->body.type = to;
	return *this;
}